

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoPrism>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoPrism> *this)

{
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoPrism>).super_TPZGeoEl =
       &PTR__TPZSavable_016b5d80;
  TPZGeoElRefLess<pzgeom::TPZGeoPrism>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZGeoPrism>,&PTR_PTR_016b27b8);
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoPrism>).super_TPZGeoEl =
       &PTR__TPZGeoElRefPattern_016b24b8;
  TPZVec<long>::TPZVec(&this->fSubEl,0);
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer(&this->fRefPattern,(TPZRefPattern *)0x0);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern():TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),
TPZGeoElRefLess<TGeo>(), fSubEl(0), fRefPattern(0)
{
}